

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O2

int cmp_u64(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*b <= *a) {
    uVar1 = (uint)(*b < *a);
  }
  return uVar1;
}

Assistant:

static int cmp_u64(const void *a, const void *b)
{
	uint64_t l = *(uint64_t *)a;
	uint64_t r = *(uint64_t *)b;

	if (l < r)
		return -1;
	if (l > r)
		return 1;
	return 0;
}